

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BuffLength::Run(BuffLength *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  GLuint index;
  long lVar1;
  GLchar buff [3];
  GLsizei length;
  GLint params [3];
  GLenum props [13];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(props,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(params,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)props._0_8_,(char *)params._0_8_,false);
  std::__cxx11::string::~string((string *)params);
  std::__cxx11::string::~string((string *)props);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  lVar1 = 0;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  index = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,program,0x92e1,"someLongName");
  buff[2] = 'c';
  buff[0] = 'a';
  buff[1] = 'b';
  glu::CallLogWrapper::glGetProgramResourceName
            (this_00,program,0x92e1,index,0,(GLsizei *)0x0,(GLchar *)0x0);
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program,0x92e1,index,0,(GLsizei *)0x0,buff);
  if (((buff[0] != 'a') || (buff[1] != 'b')) || (buff[2] != 'c')) {
    anon_unknown_0::Output("ERROR: buff has changed\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program,0x92e1,index,2,&length,buff);
  if (((buff[0] != 's') || (buff[1] != '\0')) || (buff[2] != 'c')) {
    anon_unknown_0::Output("ERROR: buff different then expected\n");
    lVar1 = -1;
  }
  if (length != 1) {
    lVar1 = -1;
    anon_unknown_0::Output("ERROR: incorrect length, expected 1, got %d\n");
  }
  params[0] = 1;
  params[1] = 2;
  params[2] = 3;
  props[8] = 0x9301;
  props[9] = 0x930b;
  props[10] = 0x930a;
  props[0xb] = 0x9306;
  props[4] = 0x92fd;
  props[5] = 0x92fe;
  props[6] = 0x92ff;
  props[7] = 0x9300;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x92fc;
  props[0xc] = 0x930e;
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,props,0,(GLsizei *)0x0,(GLint *)0x0);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,props,0,(GLsizei *)0x0,params);
  if (((params[0] != 1) || (params[1] != 2)) || (params[2] != 3)) {
    anon_unknown_0::Output("ERROR: params has changed\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,props,2,&length,params);
  if (((params[0] != 0xd) || (params[1] != 0x8b52)) || (params[2] != 3)) {
    anon_unknown_0::Output("ERROR: params has incorrect values\n");
    lVar1 = -1;
  }
  if (length != 2) {
    anon_unknown_0::Output("ERROR: incorrect length, expected 2, got %d\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		GLuint  index = glGetProgramResourceIndex(program, GL_UNIFORM, "someLongName");
		GLsizei length;
		GLchar  buff[3] = { 'a', 'b', 'c' };
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, NULL);
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, buff);
		if (buff[0] != 'a' || buff[1] != 'b' || buff[2] != 'c')
		{
			Output("ERROR: buff has changed\n");
			error = ERROR;
		}
		glGetProgramResourceName(program, GL_UNIFORM, index, 2, &length, buff);
		if (buff[0] != 's' || buff[1] != '\0' || buff[2] != 'c')
		{
			Output("ERROR: buff different then expected\n");
			error = ERROR;
		}
		if (length != 1)
		{
			Output("ERROR: incorrect length, expected 1, got %d\n", length);
			error = ERROR;
		}

		GLint  params[3] = { 1, 2, 3 };
		GLenum props[]   = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, NULL);
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, params);
		if (params[0] != 1 || params[1] != 2 || params[2] != 3)
		{
			Output("ERROR: params has changed\n");
			error = ERROR;
		}
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 2, &length, params);
		if (params[0] != 13 || params[1] != 35666 || params[2] != 3)
		{
			Output("ERROR: params has incorrect values\n");
			error = ERROR;
		}
		if (length != 2)
		{
			Output("ERROR: incorrect length, expected 2, got %d\n", length);
			error = ERROR;
		}

		glDeleteProgram(program);
		return error;
	}